

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

int32 Js::ByteCodeWriter::GetBranchLimit(void)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = ConfigFlagsTable::IsEnabled
                    ((ConfigFlagsTable *)&Configuration::Global,ByteCodeBranchLimitFlag);
  if (bVar1) {
    iVar2 = 0x40;
    if (0x40 < DAT_0143bfd8) {
      iVar2 = DAT_0143bfd8;
    }
    if (0x7fff < iVar2) {
      iVar2 = 0x8000;
    }
  }
  else {
    iVar2 = 0x8000;
  }
  return iVar2;
}

Assistant:

int32 ByteCodeWriter::GetBranchLimit()
    {
#ifdef BYTECODE_TESTING
        if (Js::Configuration::Global.flags.IsEnabled(Js::ByteCodeBranchLimitFlag))
        {
            // minimum 64
            return min(max(Js::Configuration::Global.flags.ByteCodeBranchLimit, 64), SHRT_MAX + 1);
        }
#endif

        return SHRT_MAX + 1;
    }